

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbitblb.cpp
# Opt level: O1

bool __thiscall icu_63::RBBITableBuilder::findDuplicateState(RBBITableBuilder *this,IntPair *states)

{
  int iVar1;
  int iVar2;
  char cVar3;
  int32_t iVar4;
  void *pvVar5;
  void *pvVar6;
  char cVar7;
  int iVar8;
  int32_t index;
  int iVar9;
  long lVar10;
  int iVar11;
  int iVar12;
  bool bVar13;
  bool local_41;
  
  iVar1 = this->fDStates->count;
  iVar4 = RBBISetBuilder::getNumCharCategories(this->fRB->fSetBuilder);
  iVar8 = iVar1 + -1;
  iVar9 = states->first;
  local_41 = iVar9 < iVar8;
  if (iVar9 < iVar8) {
    do {
      pvVar5 = UVector::elementAt(this->fDStates,iVar9);
      index = states->first + 1;
      states->second = index;
      if (index < iVar1) {
        do {
          pvVar6 = UVector::elementAt(this->fDStates,index);
          cVar7 = '\a';
          if ((*(int *)((long)pvVar5 + 4) == *(int *)((long)pvVar6 + 4)) &&
             (*(int *)((long)pvVar5 + 8) == *(int *)((long)pvVar6 + 8))) {
            bVar13 = *(int *)((long)pvVar5 + 0x18) != *(int *)((long)pvVar6 + 0x18);
            cVar7 = '\x01';
            if (bVar13) {
              cVar7 = '\a';
            }
            if (!bVar13 && 0 < iVar4) {
              iVar9 = *(int *)(*(long *)((long)pvVar5 + 0x28) + 8);
              iVar2 = *(int *)(*(long *)((long)pvVar6 + 0x28) + 8);
              lVar10 = 0;
              cVar3 = '\x01';
              do {
                iVar11 = 0;
                iVar12 = 0;
                if (lVar10 < iVar9 && 0 < iVar9) {
                  iVar12 = *(int *)(*(long *)(*(long *)((long)pvVar5 + 0x28) + 0x18) + lVar10 * 4);
                }
                if (lVar10 < iVar2 && 0 < iVar2) {
                  iVar11 = *(int *)(*(long *)(*(long *)((long)pvVar6 + 0x28) + 0x18) + lVar10 * 4);
                }
                if (iVar12 == iVar11) {
LAB_0015b595:
                  bVar13 = true;
                  cVar7 = cVar3;
                }
                else {
                  if (iVar12 == states->first) {
LAB_0015b581:
                    if (iVar11 != states->first) {
                      bVar13 = false;
                      cVar7 = '\0';
                      if (iVar11 != states->second) goto LAB_0015b59b;
                    }
                    goto LAB_0015b595;
                  }
                  bVar13 = false;
                  cVar7 = '\0';
                  if (iVar12 == states->second) goto LAB_0015b581;
                }
LAB_0015b59b:
              } while ((bVar13) && (lVar10 = lVar10 + 1, cVar3 = cVar7, lVar10 < iVar4));
            }
          }
          if ((cVar7 != '\a') && (cVar7 != '\0')) goto LAB_0015b5d8;
          index = states->second + 1;
          states->second = index;
        } while (index < iVar1);
        cVar7 = '\0';
LAB_0015b5d8:
        if (cVar7 != '\0') {
          return local_41;
        }
      }
      iVar9 = states->first + 1;
      states->first = iVar9;
      local_41 = iVar9 < iVar8;
    } while (iVar9 < iVar8);
  }
  return local_41;
}

Assistant:

bool RBBITableBuilder::findDuplicateState(IntPair *states) {
    int32_t numStates = fDStates->size();
    int32_t numCols = fRB->fSetBuilder->getNumCharCategories();

    for (; states->first<numStates-1; states->first++) {
        RBBIStateDescriptor *firstSD = (RBBIStateDescriptor *)fDStates->elementAt(states->first);
        for (states->second=states->first+1; states->second<numStates; states->second++) {
            RBBIStateDescriptor *duplSD = (RBBIStateDescriptor *)fDStates->elementAt(states->second);
            if (firstSD->fAccepting != duplSD->fAccepting ||
                firstSD->fLookAhead != duplSD->fLookAhead ||
                firstSD->fTagsIdx   != duplSD->fTagsIdx) {
                continue;
            }
            bool rowsMatch = true;
            for (int32_t col=0; col < numCols; ++col) {
                int32_t firstVal = firstSD->fDtran->elementAti(col);
                int32_t duplVal = duplSD->fDtran->elementAti(col);
                if (!((firstVal == duplVal) ||
                        ((firstVal == states->first || firstVal == states->second) &&
                        (duplVal  == states->first || duplVal  == states->second)))) {
                    rowsMatch = false;
                    break;
                }
            }
            if (rowsMatch) {
                return true;
            }
        }
    }
    return false;
}